

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::undo(Fl_Input_ *this)

{
  uint *puVar1;
  int n;
  uint uVar2;
  ulong uVar3;
  uint p;
  int iVar4;
  int iVar5;
  wchar_t local_3c;
  size_t local_38;
  
  n = undoinsert;
  iVar4 = undocut;
  was_up_down = 0;
  iVar5 = 0;
  if (undowidget == this) {
    iVar5 = 0;
    if (undocut != 0 || undoinsert != 0) {
      p = undoat - undoinsert;
      put_in_buffer(this,this->size_ + undocut);
      uVar2 = p;
      if (iVar4 != 0) {
        memmove(this->buffer + (int)p + iVar4,this->buffer + (int)p,
                (long)(int)((this->size_ - p) + 1));
        memcpy(this->buffer + (int)p,undobuffer,(long)iVar4);
        this->size_ = this->size_ + iVar4;
        uVar2 = p + iVar4;
      }
      if (n != 0) {
        local_38 = (size_t)n;
        undobuffersize(n);
        memcpy(undobuffer,this->buffer + (int)uVar2,local_38);
        memmove(this->buffer + (int)uVar2,this->buffer + (int)uVar2 + local_38,
                (long)(int)((this->size_ - (n + uVar2)) + 1));
        this->size_ = this->size_ - n;
        yankcut = n;
      }
      undocut = n;
      undoinsert = iVar4;
      undoat = uVar2;
      this->mark_ = uVar2;
      this->position_ = uVar2;
      if ((0 < (int)p & (this->super_Fl_Widget).type_ >> 4) == 1) {
        uVar3 = (ulong)p;
        iVar4 = p + 1;
        do {
          local_3c = L'\0';
          uVar2 = fl_utf8decode(this->value_ + uVar3,this->value_ + this->size_,&local_3c);
          if (uVar2 == 10) {
            p = (uint)uVar3;
            goto LAB_00183709;
          }
          uVar3 = uVar3 - 1;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
        p = 0;
      }
LAB_00183709:
      minimal_update(this,p);
      puVar1 = &(this->super_Fl_Widget).flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      iVar5 = 1;
      if (((this->super_Fl_Widget).when_ & 1) != 0) {
        Fl_Widget::do_callback
                  (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_)
        ;
      }
    }
  }
  return iVar5;
}

Assistant:

int Fl_Input_::undo() {
  was_up_down = 0;
  if ( undowidget != this || (!undocut && !undoinsert) ) return 0;

  int ilen = undocut;
  int xlen = undoinsert;
  int b = undoat-xlen;
  int b1 = b;

  put_in_buffer(size_+ilen);

  if (ilen) {
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, undobuffer, ilen);
    size_ += ilen;
    b += ilen;
  }

  if (xlen) {
    undobuffersize(xlen);
    memcpy(undobuffer, buffer+b, xlen);
    memmove(buffer+b, buffer+b+xlen, size_-xlen-b+1);
    size_ -= xlen;
  }

  undocut = xlen;
  if (xlen) yankcut = xlen;
  undoinsert = ilen;
  undoat = b;
  mark_ = b /* -ilen */;
  position_ = b;

  if (wrap())
    while (b1 > 0 && index(b1)!='\n') b1--;
  minimal_update(b1);
  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}